

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generalizers.cpp
# Opt level: O0

bool Am_Replace_Placeholders
               (Am_Object *cmd,Am_Slot_Key slot,bool *did_a_replace,Am_Value *orig_value,
               Am_Value *new_value,Am_Object *sel_widget)

{
  bool bVar1;
  byte bVar2;
  bool bVar3;
  unsigned_short uVar4;
  Am_Value *pAVar5;
  ostream *poVar6;
  void *pvVar7;
  Am_Wrapper *in_value;
  bool local_1c9;
  bool local_191;
  bool local_181;
  undefined1 local_168 [8];
  Am_Value_List l;
  Am_Value_List local_150;
  undefined1 local_140 [8];
  Am_Placeholder_Replace_Method replace_method_1;
  Am_Object local_128;
  byte local_119;
  Am_Object local_118;
  Am_Value_List local_110;
  undefined1 local_100 [8];
  Am_Placeholder_Replace_Method replace_method;
  Am_Object local_e8;
  byte local_d9;
  Am_Object local_d8;
  undefined1 local_d0 [8];
  Am_Value_List new_list;
  Am_Object local_b8;
  byte local_a9;
  Am_Object local_a8;
  byte local_99;
  undefined1 local_98 [7];
  bool found_one;
  Am_Value_List orig_list;
  Am_Object local_80;
  Am_Object ph;
  bool ok;
  undefined1 local_68 [8];
  Am_Value ret_val;
  Am_Value val;
  Am_Object *sel_widget_local;
  Am_Value *new_value_local;
  Am_Value *orig_value_local;
  bool *did_a_replace_local;
  Am_Slot_Key slot_local;
  Am_Object *cmd_local;
  
  pAVar5 = Am_Object::Peek(cmd,slot,0);
  Am_Value::operator=(orig_value,pAVar5);
  if ((am_sdebug & 1U) != 0) {
    poVar6 = std::operator<<((ostream *)&std::cout,"Checking placeholders for cmd ");
    poVar6 = operator<<(poVar6,cmd);
    poVar6 = std::operator<<(poVar6," slot ");
    Am_Am_Slot_Key::Am_Am_Slot_Key((Am_Am_Slot_Key *)((long)&val.value + 6),slot);
    poVar6 = operator<<(poVar6,(Am_Am_Slot_Key *)((long)&val.value + 6));
    poVar6 = std::operator<<(poVar6," orig value ");
    poVar6 = operator<<(poVar6,orig_value);
    pvVar7 = (void *)std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(pvVar7,std::flush<char,std::char_traits<char>>);
  }
  Am_Value::Am_Value((Am_Value *)&ret_val.value);
  Am_Value::Am_Value((Am_Value *)local_68);
  *did_a_replace = false;
  Am_Object::Am_Object(&local_80);
  bVar1 = Am_Value::Valid(orig_value);
  if (bVar1) {
    bVar1 = Am_Value_List::Test(orig_value);
    if (bVar1) {
      Am_Value_List::Am_Value_List((Am_Value_List *)local_98,orig_value);
      local_99 = 0;
      Am_Value_List::Start((Am_Value_List *)local_98);
      while (bVar1 = Am_Value_List::Last((Am_Value_List *)local_98), ((bVar1 ^ 0xffU) & 1) != 0) {
        pAVar5 = Am_Value_List::Get((Am_Value_List *)local_98);
        Am_Value::operator=((Am_Value *)&ret_val.value,pAVar5);
        local_a9 = 0;
        new_list.item._7_1_ = 0;
        local_181 = false;
        if (ret_val.value.long_value._0_2_ == -0x5fff) {
          Am_Object::Am_Object(&local_a8,(Am_Value *)&ret_val.value);
          local_a9 = 1;
          Am_Object::Am_Object(&local_b8,&Am_A_Placeholder);
          new_list.item._7_1_ = 1;
          local_181 = Am_Object::Is_Instance_Of(&local_a8,&local_b8);
        }
        if ((new_list.item._7_1_ & 1) != 0) {
          Am_Object::~Am_Object(&local_b8);
        }
        if ((local_a9 & 1) != 0) {
          Am_Object::~Am_Object(&local_a8);
        }
        if (local_181 != false) {
          local_99 = 1;
          break;
        }
        Am_Value_List::Next((Am_Value_List *)local_98);
      }
      if ((local_99 & 1) == 0) {
        cmd_local._7_1_ = 1;
        orig_list.item._4_4_ = 1;
      }
      else {
        Am_Value_List::Am_Value_List((Am_Value_List *)local_d0);
        Am_Value_List::Start((Am_Value_List *)local_98);
        while (bVar1 = Am_Value_List::Last((Am_Value_List *)local_98), ((bVar1 ^ 0xffU) & 1) != 0) {
          pAVar5 = Am_Value_List::Get((Am_Value_List *)local_98);
          Am_Value::operator=((Am_Value *)&ret_val.value,pAVar5);
          local_d9 = 0;
          replace_method.Call._7_1_ = 0;
          local_191 = false;
          if (ret_val.value.long_value._0_2_ == -0x5fff) {
            Am_Object::Am_Object(&local_d8,(Am_Value *)&ret_val.value);
            local_d9 = 1;
            Am_Object::Am_Object(&local_e8,&Am_A_Placeholder);
            replace_method.Call._7_1_ = 1;
            local_191 = Am_Object::Is_Instance_Of(&local_d8,&local_e8);
          }
          if ((replace_method.Call._7_1_ & 1) != 0) {
            Am_Object::~Am_Object(&local_e8);
          }
          if ((local_d9 & 1) != 0) {
            Am_Object::~Am_Object(&local_d8);
          }
          if (local_191 == false) {
            Am_Value_List::Add((Am_Value_List *)local_d0,(Am_Value *)&ret_val.value,Am_TAIL,true);
          }
          else {
            Am_Object::operator=(&local_80,(Am_Value *)&ret_val.value);
            pAVar5 = Am_Object::Get(&local_80,Am_PLACEHOLDER_REPLACE_METHOD,0);
            Am_Placeholder_Replace_Method::Am_Placeholder_Replace_Method
                      ((Am_Placeholder_Replace_Method *)local_100,pAVar5);
            bVar2 = (*(code *)replace_method.from_wrapper)(&local_80,local_68,sel_widget);
            ph.data._3_1_ = bVar2 & 1;
            if (ph.data._3_1_ == 0) {
              cmd_local._7_1_ = 0;
              orig_list.item._4_4_ = 1;
              goto LAB_0029b577;
            }
            bVar1 = Am_Value::Valid((Am_Value *)local_68);
            if (bVar1) {
              bVar1 = Am_Value_List::Test((Am_Value *)local_68);
              if (bVar1) {
                Am_Value_List::Am_Value_List(&local_110,(Am_Value *)local_68);
                Am_Value_List::Append((Am_Value_List *)local_d0,&local_110,true);
                Am_Value_List::~Am_Value_List(&local_110);
              }
              else {
                Am_Value_List::Add((Am_Value_List *)local_d0,(Am_Value *)local_68,Am_TAIL,true);
              }
            }
          }
          Am_Value_List::Next((Am_Value_List *)local_98);
        }
        *did_a_replace = true;
        in_value = Am_Value_List::operator_cast_to_Am_Wrapper_((Am_Value_List *)local_d0);
        Am_Value::operator=(new_value,in_value);
        if ((am_sdebug & 1U) != 0) {
          poVar6 = std::operator<<((ostream *)&std::cout,
                                   "Found placeholders in list and replaced with ");
          poVar6 = operator<<(poVar6,new_value);
          pvVar7 = (void *)std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
          std::ostream::operator<<(pvVar7,std::flush<char,std::char_traits<char>>);
        }
        orig_list.item._4_4_ = 0;
LAB_0029b577:
        Am_Value_List::~Am_Value_List((Am_Value_List *)local_d0);
        if (orig_list.item._4_4_ == 0) {
          orig_list.item._4_4_ = 0;
        }
      }
      Am_Value_List::~Am_Value_List((Am_Value_List *)local_98);
      if (orig_list.item._4_4_ != 0) goto LAB_0029b93b;
    }
    else {
      local_119 = 0;
      replace_method_1.Call._7_1_ = 0;
      local_1c9 = false;
      if (orig_value->type == 0xa001) {
        Am_Object::Am_Object(&local_118,orig_value);
        local_119 = 1;
        Am_Object::Am_Object(&local_128,&Am_A_Placeholder);
        replace_method_1.Call._7_1_ = 1;
        local_1c9 = Am_Object::Is_Instance_Of(&local_118,&local_128);
      }
      if ((replace_method_1.Call._7_1_ & 1) != 0) {
        Am_Object::~Am_Object(&local_128);
      }
      if ((local_119 & 1) != 0) {
        Am_Object::~Am_Object(&local_118);
      }
      if (local_1c9 != false) {
        Am_Object::operator=(&local_80,orig_value);
        pAVar5 = Am_Object::Get(&local_80,Am_PLACEHOLDER_REPLACE_METHOD,0);
        Am_Placeholder_Replace_Method::Am_Placeholder_Replace_Method
                  ((Am_Placeholder_Replace_Method *)local_140,pAVar5);
        bVar2 = (*(code *)replace_method_1.from_wrapper)(&local_80,new_value,sel_widget);
        ph.data._3_1_ = bVar2 & 1;
        l.item._7_1_ = 0;
        bVar3 = Am_Value_List::Test(new_value);
        bVar1 = false;
        if (bVar3) {
          Am_Value_List::Am_Value_List(&local_150,new_value);
          l.item._7_1_ = 1;
          uVar4 = Am_Value_List::Length(&local_150);
          bVar1 = uVar4 == 1;
        }
        if ((l.item._7_1_ & 1) != 0) {
          Am_Value_List::~Am_Value_List(&local_150);
        }
        if (bVar1) {
          Am_Value_List::Am_Value_List((Am_Value_List *)local_168,new_value);
          Am_Value_List::Start((Am_Value_List *)local_168);
          pAVar5 = Am_Value_List::Get((Am_Value_List *)local_168);
          Am_Value::operator=(new_value,pAVar5);
          Am_Value_List::~Am_Value_List((Am_Value_List *)local_168);
        }
        if ((ph.data._3_1_ & 1) == 0) {
          cmd_local._7_1_ = 0;
          orig_list.item._4_4_ = 1;
          goto LAB_0029b93b;
        }
        *did_a_replace = true;
        if ((am_sdebug & 1U) != 0) {
          poVar6 = std::operator<<((ostream *)&std::cout,"Found one placeholder and replaced with ")
          ;
          poVar6 = operator<<(poVar6,new_value);
          pvVar7 = (void *)std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
          std::ostream::operator<<(pvVar7,std::flush<char,std::char_traits<char>>);
        }
      }
    }
    cmd_local._7_1_ = 1;
    orig_list.item._4_4_ = 1;
  }
  else {
    cmd_local._7_1_ = 1;
    orig_list.item._4_4_ = 1;
  }
LAB_0029b93b:
  Am_Object::~Am_Object(&local_80);
  Am_Value::~Am_Value((Am_Value *)local_68);
  Am_Value::~Am_Value((Am_Value *)&ret_val.value);
  return (bool)(cmd_local._7_1_ & 1);
}

Assistant:

bool
Am_Replace_Placeholders(Am_Object &cmd, Am_Slot_Key slot, bool &did_a_replace,
                        Am_Value &orig_value, Am_Value &new_value,
                        Am_Object &sel_widget)
{
  orig_value = cmd.Peek(slot);
  if (am_sdebug)
    std::cout << "Checking placeholders for cmd " << cmd << " slot "
              << Am_Am_Slot_Key(slot) << " orig value " << orig_value
              << std::endl
              << std::flush;
  Am_Value val, ret_val;
  bool ok;
  did_a_replace = false;
  Am_Object ph;
  if (!orig_value.Valid())
    return true; //nothing to do, and is OK
  else if (Am_Value_List::Test(orig_value)) {
    Am_Value_List orig_list = orig_value;
    //first, search to see if any placeholders
    bool found_one = false;
    for (orig_list.Start(); !orig_list.Last(); orig_list.Next()) {
      val = orig_list.Get();
      if (val.type == Am_OBJECT &&
          Am_Object(val).Is_Instance_Of(Am_A_Placeholder)) {
        found_one = true;
        break;
      }
    }
    if (!found_one)
      return true;
    else {
      Am_Value_List new_list;
      for (orig_list.Start(); !orig_list.Last(); orig_list.Next()) {
        val = orig_list.Get();
        if (val.type == Am_OBJECT &&
            Am_Object(val).Is_Instance_Of(Am_A_Placeholder)) {
          ph = val;
          Am_Placeholder_Replace_Method replace_method =
              ph.Get(Am_PLACEHOLDER_REPLACE_METHOD);
          ok = replace_method.Call(ph, ret_val, sel_widget);
          if (!ok)
            return false;
          if (ret_val.Valid()) { //otherwise, leave new_list without ret_val
            if (Am_Value_List::Test(ret_val))
              new_list.Append(ret_val);
            else
              new_list.Add(ret_val);
          }
        } else
          new_list.Add(val);
      }
      did_a_replace = true;
      new_value = new_list;
      if (am_sdebug)
        std::cout << "Found placeholders in list and replaced with "
                  << new_value << std::endl
                  << std::flush;
    }
  } else { //not a list
    if (orig_value.type == Am_OBJECT &&
        Am_Object(orig_value).Is_Instance_Of(Am_A_Placeholder)) {
      ph = orig_value;
      Am_Placeholder_Replace_Method replace_method =
          ph.Get(Am_PLACEHOLDER_REPLACE_METHOD);
      ok = replace_method.Call(ph, new_value, sel_widget);
      if (Am_Value_List::Test(new_value) &&
          Am_Value_List(new_value).Length() == 1) {
        Am_Value_List l = new_value;
        l.Start();
        new_value = l.Get();
      }
      if (!ok)
        return false;
      did_a_replace = true;
      if (am_sdebug)
        std::cout << "Found one placeholder and replaced with " << new_value
                  << std::endl
                  << std::flush;
    }
  }
  return true;
}